

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::anon_unknown_0::PrinterTest_EmitWithIndent_Test::TestBody
          (PrinterTest_EmitWithIndent_Test *this)

{
  Printer *this_00;
  initializer_list<google::protobuf::io::Printer::Sub> v_00;
  bool bVar1;
  ZeroCopyOutputStream *output;
  char *message;
  optional<unsigned_long> indent;
  Sub *local_4d8;
  AssertHelper local_498;
  Message local_490;
  string_view local_488;
  undefined1 local_478 [8];
  AssertionResult gtest_ar;
  basic_string_view<char,_std::char_traits<char>_> local_460;
  undefined1 local_44a;
  allocator<char> local_449;
  string local_448;
  allocator<char> local_421;
  string local_420;
  allocator<char> local_3f9;
  string local_3f8;
  Sub *local_3d8;
  Sub local_3d0;
  Sub local_318;
  Sub local_260;
  iterator local_1a8;
  size_type local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_198 [2];
  undefined1 local_170 [12];
  undefined1 local_160 [8];
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:580:30)>
  v;
  Printer printer;
  PrinterTest_EmitWithIndent_Test *this_local;
  
  output = PrinterTest::output(&this->super_PrinterTest);
  this_00 = (Printer *)(v.storage_.callback_buffer_ + 8);
  Printer::Printer(this_00,output);
  std::optional<unsigned_long>::optional((optional<unsigned_long> *)local_170);
  indent.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._12_4_ = 0;
  indent.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload =
       (_Storage<unsigned_long,_true>)local_170._0_8_;
  indent.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_engaged = (bool)local_170[8];
  indent.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._9_3_ = local_170._9_3_;
  Printer::WithIndent((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:580:30)>
                       *)local_160,this_00,indent);
  local_44a = 1;
  local_3d8 = &local_3d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f8,"f1",&local_3f9);
  Printer::Sub::Sub<char_const(&)[2]>
            (&local_3d0,&local_3f8,(char (*) [2])(anon_var_dwarf_68fa2a + 8));
  local_3d8 = &local_318;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_420,"f2",&local_421);
  Printer::Sub::Sub<char_const(&)[2]>(&local_318,&local_420,(char (*) [2])0x212f889);
  local_3d8 = &local_260;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_448,"f3",&local_449);
  Printer::Sub::Sub<char_const(&)[2]>(&local_260,&local_448,(char (*) [2])0x1ea2f37);
  local_44a = 0;
  local_1a8 = &local_3d0;
  local_1a0 = 3;
  v_00._M_len = 3;
  v_00._M_array = local_1a8;
  absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
  Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
            ((Span<google::protobuf::io::Printer::Sub_const> *)local_198[0]._M_local_buf,v_00);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_460,"\n      class Foo {\n        int $f1$, $f2$, $f3$;\n      };\n    ");
  Printer::SourceLocation::current();
  Printer::Emit((Printer *)(v.storage_.callback_buffer_ + 8),local_198[0]._M_allocated_capacity,
                local_198[0]._8_8_,local_460._M_len,local_460._M_str);
  local_4d8 = (Sub *)&local_1a8;
  do {
    local_4d8 = local_4d8 + -1;
    Printer::Sub::~Sub(local_4d8);
  } while (local_4d8 != &local_3d0);
  std::__cxx11::string::~string((string *)&local_448);
  std::allocator<char>::~allocator(&local_449);
  std::__cxx11::string::~string((string *)&local_420);
  std::allocator<char>::~allocator(&local_421);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::allocator<char>::~allocator(&local_3f9);
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:580:30)>
  ::~Cleanup((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:580:30)>
              *)local_160);
  Printer::~Printer((Printer *)(v.storage_.callback_buffer_ + 8));
  local_488 = PrinterTest::written(&this->super_PrinterTest);
  testing::internal::EqHelper::
  Compare<std::basic_string_view<char,_std::char_traits<char>_>,_char[37],_nullptr>
            ((EqHelper *)local_478,"written()",
             "\"  class Foo {\\n\" \"    int x, y, z;\\n\" \"  };\\n\"",&local_488,
             (char (*) [37])"  class Foo {\n    int x, y, z;\n  };\n");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_478);
  if (!bVar1) {
    testing::Message::Message(&local_490);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_478);
    testing::internal::AssertHelper::AssertHelper
              (&local_498,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer_unittest.cc"
               ,0x2c9,message);
    testing::internal::AssertHelper::operator=(&local_498,&local_490);
    testing::internal::AssertHelper::~AssertHelper(&local_498);
    testing::Message::~Message(&local_490);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_478);
  return;
}

Assistant:

TEST_F(PrinterTest, EmitWithIndent) {
  {
    Printer printer(output());
    auto v = printer.WithIndent();
    printer.Emit({{"f1", "x"}, {"f2", "y"}, {"f3", "z"}}, R"cc(
      class Foo {
        int $f1$, $f2$, $f3$;
      };
    )cc");
  }

  EXPECT_EQ(written(),
            "  class Foo {\n"
            "    int x, y, z;\n"
            "  };\n");
}